

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoplus.hpp
# Opt level: O0

void __thiscall EOPlus::State::State(State *this)

{
  State *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->has_desc = false;
  std::__cxx11::string::string((string *)&this->desc);
  std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::deque(&this->rules);
  std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::deque(&this->actions);
  this->goal_rule = 0;
  return;
}

Assistant:

State()
			: has_desc(false)
			, goal_rule(0)
		{ }